

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getnameinfo.c
# Opt level: O1

void uv__getnameinfo_done(uv__work *w,int status)

{
  uint uVar1;
  
  uVar1 = ((w[-2].loop)->active_reqs).count;
  if (uVar1 == 0) {
    __assert_fail("uv__has_active_reqs(req->loop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/getnameinfo.c"
                  ,0x3d,"void uv__getnameinfo_done(struct uv__work *, int)");
  }
  ((w[-2].loop)->active_reqs).count = uVar1 - 1;
  if (status == -0x7d) {
    if (*(int *)&w[0x1f].work != 0) {
      __assert_fail("req->retcode == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/getnameinfo.c"
                    ,0x41,"void uv__getnameinfo_done(struct uv__work *, int)");
    }
    *(undefined4 *)&w[0x1f].work = 0xfffff445;
  }
  if (w[1].work != (_func_void_uv__work_ptr *)0x0) {
    (*w[1].work)((uv__work *)&w[-2].done);
    return;
  }
  return;
}

Assistant:

static void uv__getnameinfo_done(struct uv__work* w, int status) {
  uv_getnameinfo_t* req;
  char* host;
  char* service;

  req = container_of(w, uv_getnameinfo_t, work_req);
  uv__req_unregister(req->loop, req);
  host = service = NULL;

  if (status == UV_ECANCELED) {
    assert(req->retcode == 0);
    req->retcode = UV_EAI_CANCELED;
  } else if (req->retcode == 0) {
    host = req->host;
    service = req->service;
  }

  if (req->getnameinfo_cb)
    req->getnameinfo_cb(req, req->retcode, host, service);
}